

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

int mg_relationship_equal(mg_relationship *lhs,mg_relationship *rhs)

{
  int iVar1;
  
  if (((lhs->id == rhs->id) && (lhs->start_id == rhs->start_id)) && (lhs->end_id == rhs->end_id)) {
    iVar1 = mg_string_equal(lhs->type,rhs->type);
    if (iVar1 != 0) {
      iVar1 = mg_map_equal(lhs->properties,rhs->properties);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int mg_relationship_equal(const mg_relationship *lhs,
                          const mg_relationship *rhs) {
  if (lhs->id != rhs->id || lhs->start_id != rhs->start_id ||
      lhs->end_id != rhs->end_id) {
    return 0;
  }
  if (!mg_string_equal(lhs->type, rhs->type)) {
    return 0;
  }
  return mg_map_equal(lhs->properties, rhs->properties);
}